

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

void Fra_ClauMinimizeClause_rec(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  
  uVar7 = (ulong)(uint)vExtra->nSize;
  if (vExtra->nSize != 1) {
    iVar1 = vBasis->nSize;
    piVar9 = &vExtra->nSize;
    do {
      if ((int)(uint)uVar7 < 2) {
        __assert_fail("Vec_IntSize(vVec) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                      ,0x134,"Vec_Int_t *Vec_IntSplitHalf(Vec_Int_t *)");
      }
      uVar6 = uVar7 >> 1 & 0x7fffffff;
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar2 = (int)uVar6 + 1;
      if ((uint)uVar7 < 0x1e) {
        uVar2 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar2;
      piVar5 = (int *)malloc((ulong)uVar2 << 2);
      p_00->pArray = piVar5;
      do {
        Vec_IntPush(p_00,vExtra->pArray[uVar6]);
        uVar6 = uVar6 + 1;
        uVar2 = *piVar9;
      } while ((int)uVar6 < (int)uVar2);
      if ((int)uVar2 < 0) goto LAB_005cbd47;
      *piVar9 = uVar2 >> 1;
      if (1 < uVar2) {
        lVar8 = 0;
        do {
          Vec_IntPush(vBasis,vExtra->pArray[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < *piVar9);
      }
      iVar4 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
      if (iVar4 == 0) {
        if (vBasis->nSize < iVar1) goto LAB_005cbd47;
        piVar5 = &p_00->nSize;
        vBasis->nSize = iVar1;
        uVar7 = (ulong)*piVar5;
        if (0 < (long)uVar7) {
          piVar3 = p_00->pArray;
          uVar6 = 0;
          do {
            Vec_IntPush(vBasis,piVar3[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar7);
        }
        iVar4 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
        if (iVar4 == 0) {
          Fra_ClauMinimizeClause_rec(p,vBasis,vExtra);
          if (iVar1 <= vBasis->nSize) {
            vBasis->nSize = iVar1;
            if (0 < *piVar9) {
              lVar8 = 0;
              do {
                Vec_IntPush(vBasis,vExtra->pArray[lVar8]);
                lVar8 = lVar8 + 1;
              } while (lVar8 < *piVar9);
            }
            Fra_ClauMinimizeClause_rec(p,vBasis,p_00);
            if (iVar1 <= vBasis->nSize) {
              vBasis->nSize = iVar1;
              if (0 < *piVar5) {
                lVar8 = 0;
                do {
                  Vec_IntPush(vExtra,p_00->pArray[lVar8]);
                  lVar8 = lVar8 + 1;
                } while (lVar8 < p_00->nSize);
              }
              if (p_00->pArray != (int *)0x0) {
                free(p_00->pArray);
              }
              free(p_00);
              return;
            }
          }
LAB_005cbd47:
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        if (vBasis->nSize < iVar1) goto LAB_005cbd47;
        vBasis->nSize = iVar1;
      }
      else {
        if (vBasis->nSize < iVar1) goto LAB_005cbd47;
        vBasis->nSize = iVar1;
        uVar7 = (ulong)(uint)*piVar9;
        p_00 = vExtra;
        piVar5 = piVar9;
      }
      vExtra = p_00;
      piVar9 = piVar5;
    } while ((int)uVar7 != 1);
  }
  return;
}

Assistant:

void Fra_ClauMinimizeClause_rec( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    Vec_Int_t * vExtra2;
    int nSizeOld;
    if ( Vec_IntSize(vExtra) == 1 )
        return;
    nSizeOld = Vec_IntSize( vBasis );
    vExtra2 = Vec_IntSplitHalf( vExtra );

    // try the first half
    Vec_IntAppend( vBasis, vExtra );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
        return;
    }
    Vec_IntShrink( vBasis, nSizeOld );

    // try the second half
    Vec_IntAppend( vBasis, vExtra2 );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
        return;
    }
//    Vec_IntShrink( vBasis, nSizeOld );

    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vBasis, vExtra );
    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vExtra, vExtra2 );
    Vec_IntFree( vExtra2 );
}